

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  ushort uVar2;
  ushort uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined4 uVar39;
  undefined4 uVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined4 uVar50;
  byte bVar51;
  int iVar52;
  undefined4 uVar53;
  ulong uVar54;
  long lVar55;
  uint uVar56;
  ulong uVar57;
  long lVar58;
  long lVar59;
  uint uVar60;
  uint uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  long lVar69;
  bool bVar70;
  float fVar71;
  float fVar77;
  float fVar78;
  vint4 ai_1;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  float fVar85;
  float fVar98;
  float fVar99;
  vint4 ai;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar100;
  undefined1 auVar93 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar104;
  float fVar105;
  float fVar115;
  float fVar116;
  vint4 ai_3;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar117;
  undefined1 auVar111 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  vint4 ai_2;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  float fVar142;
  undefined1 auVar143 [32];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar144 [64];
  float fVar151;
  uint uVar152;
  uint uVar156;
  uint uVar158;
  float fVar159;
  uint uVar160;
  undefined1 auVar153 [16];
  float fVar155;
  float fVar157;
  float fVar161;
  uint uVar162;
  float fVar163;
  uint uVar164;
  float fVar165;
  uint uVar166;
  uint uVar167;
  undefined1 auVar154 [64];
  float fVar168;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar169 [32];
  float fVar176;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar177 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  float fVar189;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar190 [32];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [244];
  undefined1 local_c60 [16];
  undefined1 (*local_c50) [16];
  ulong local_c48;
  ulong local_c40;
  ulong local_c38;
  ulong local_c30;
  ulong local_c28;
  ulong local_c20;
  ulong *local_c18;
  ulong local_c10;
  ulong local_c08;
  ulong local_c00;
  ulong local_bf8;
  ulong local_bf0;
  ulong local_be8;
  long local_be0;
  long local_bd8;
  ulong local_bd0;
  ulong local_bc8;
  long local_bc0;
  long local_bb8;
  RTCFilterFunctionNArguments local_bb0;
  undefined1 local_b80 [16];
  undefined1 auStack_b70 [16];
  undefined1 local_b60 [16];
  undefined1 auStack_b50 [16];
  undefined1 local_b40 [16];
  undefined1 auStack_b30 [16];
  undefined1 local_b20 [16];
  undefined1 local_b10 [16];
  float local_b00;
  float fStack_afc;
  float fStack_af8;
  float fStack_af4;
  float local_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [32];
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [16];
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  undefined1 local_a30 [16];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined1 local_a10 [16];
  uint local_a00;
  uint uStack_9fc;
  uint uStack_9f8;
  uint uStack_9f4;
  uint uStack_9f0;
  uint uStack_9ec;
  uint uStack_9e8;
  uint uStack_9e4;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  float local_8a0 [4];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined4 uStack_844;
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  float local_820 [4];
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined4 uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_c18 = local_7f8;
  local_800 = root.ptr;
  uVar50 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_ab0._4_4_ = uVar50;
  local_ab0._0_4_ = uVar50;
  local_ab0._8_4_ = uVar50;
  local_ab0._12_4_ = uVar50;
  auVar141 = ZEXT1664(local_ab0);
  uVar50 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_ac0._4_4_ = uVar50;
  local_ac0._0_4_ = uVar50;
  local_ac0._8_4_ = uVar50;
  local_ac0._12_4_ = uVar50;
  auVar144 = ZEXT1664(local_ac0);
  uVar50 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_ad0._4_4_ = uVar50;
  local_ad0._0_4_ = uVar50;
  local_ad0._8_4_ = uVar50;
  local_ad0._12_4_ = uVar50;
  auVar154 = ZEXT1664(local_ad0);
  fVar85 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar78 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar79 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar62 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar63 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar64 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar65 = uVar62 ^ 0x10;
  uVar57 = uVar63 ^ 0x10;
  uVar67 = uVar64 ^ 0x10;
  iVar52 = (tray->tnear).field_0.i[k];
  local_b10._4_4_ = iVar52;
  local_b10._0_4_ = iVar52;
  local_b10._8_4_ = iVar52;
  local_b10._12_4_ = iVar52;
  auVar186 = ZEXT1664(local_b10);
  iVar52 = (tray->tfar).field_0.i[k];
  local_b20._4_4_ = iVar52;
  local_b20._0_4_ = iVar52;
  local_b20._8_4_ = iVar52;
  local_b20._12_4_ = iVar52;
  auVar188 = ZEXT1664(local_b20);
  local_be8 = uVar62 >> 2;
  local_bf0 = uVar65 >> 2;
  local_9a0._16_16_ = mm_lookupmask_ps._240_16_;
  local_9a0._0_16_ = mm_lookupmask_ps._0_16_;
  local_c50 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_bf8 = uVar63 >> 2;
  local_c00 = uVar57 >> 2;
  local_c08 = uVar64 >> 2;
  local_c10 = uVar67 >> 2;
  auVar75._8_4_ = 0xbf800000;
  auVar75._0_8_ = 0xbf800000bf800000;
  auVar75._12_4_ = 0xbf800000;
  auVar75._16_4_ = 0xbf800000;
  auVar75._20_4_ = 0xbf800000;
  auVar75._24_4_ = 0xbf800000;
  auVar75._28_4_ = 0xbf800000;
  auVar112._8_4_ = 0x3f800000;
  auVar112._0_8_ = 0x3f8000003f800000;
  auVar112._12_4_ = 0x3f800000;
  auVar112._16_4_ = 0x3f800000;
  auVar112._20_4_ = 0x3f800000;
  auVar112._24_4_ = 0x3f800000;
  auVar112._28_4_ = 0x3f800000;
  _local_9c0 = vblendvps_avx(auVar112,auVar75,local_9a0);
  bVar70 = true;
  fVar80 = fVar85;
  fVar82 = fVar85;
  fVar84 = fVar85;
  fVar81 = fVar78;
  fVar83 = fVar78;
  fVar98 = fVar78;
  fVar99 = fVar79;
  fVar100 = fVar79;
  fVar101 = fVar79;
  local_c48 = uVar67;
  local_c40 = uVar57;
  local_c38 = uVar65;
  local_c30 = uVar64;
  local_c28 = uVar63;
  local_c20 = uVar62;
  local_b00 = fVar79;
  fStack_afc = fVar79;
  fStack_af8 = fVar79;
  fStack_af4 = fVar79;
  local_af0 = fVar78;
  fStack_aec = fVar78;
  fStack_ae8 = fVar78;
  fStack_ae4 = fVar78;
  local_ae0 = fVar85;
  fStack_adc = fVar85;
  fStack_ad8 = fVar85;
  fStack_ad4 = fVar85;
  do {
    uVar66 = local_c18[-1];
    local_c18 = local_c18 + -1;
    while ((uVar66 & 8) == 0) {
      auVar72 = vsubps_avx(*(undefined1 (*) [16])(uVar66 + 0x20 + uVar62),auVar141._0_16_);
      auVar91._0_4_ = fVar85 * auVar72._0_4_;
      auVar91._4_4_ = fVar80 * auVar72._4_4_;
      auVar91._8_4_ = fVar82 * auVar72._8_4_;
      auVar91._12_4_ = fVar84 * auVar72._12_4_;
      auVar72 = vsubps_avx(*(undefined1 (*) [16])(uVar66 + 0x20 + uVar63),auVar144._0_16_);
      auVar92._0_4_ = fVar78 * auVar72._0_4_;
      auVar92._4_4_ = fVar81 * auVar72._4_4_;
      auVar92._8_4_ = fVar83 * auVar72._8_4_;
      auVar92._12_4_ = fVar98 * auVar72._12_4_;
      auVar72 = vpmaxsd_avx(auVar91,auVar92);
      auVar91 = vsubps_avx(*(undefined1 (*) [16])(uVar66 + 0x20 + uVar64),auVar154._0_16_);
      auVar86._0_4_ = fVar79 * auVar91._0_4_;
      auVar86._4_4_ = fVar99 * auVar91._4_4_;
      auVar86._8_4_ = fVar100 * auVar91._8_4_;
      auVar86._12_4_ = fVar101 * auVar91._12_4_;
      auVar91 = vsubps_avx(*(undefined1 (*) [16])(uVar66 + 0x20 + uVar65),auVar141._0_16_);
      auVar106._0_4_ = fVar85 * auVar91._0_4_;
      auVar106._4_4_ = fVar80 * auVar91._4_4_;
      auVar106._8_4_ = fVar82 * auVar91._8_4_;
      auVar106._12_4_ = fVar84 * auVar91._12_4_;
      auVar91 = vsubps_avx(*(undefined1 (*) [16])(uVar66 + 0x20 + uVar57),auVar144._0_16_);
      auVar121._0_4_ = fVar78 * auVar91._0_4_;
      auVar121._4_4_ = fVar81 * auVar91._4_4_;
      auVar121._8_4_ = fVar83 * auVar91._8_4_;
      auVar121._12_4_ = fVar98 * auVar91._12_4_;
      auVar92 = vpminsd_avx(auVar106,auVar121);
      auVar91 = vsubps_avx(*(undefined1 (*) [16])(uVar66 + 0x20 + uVar67),auVar154._0_16_);
      auVar122._0_4_ = fVar79 * auVar91._0_4_;
      auVar122._4_4_ = fVar99 * auVar91._4_4_;
      auVar122._8_4_ = fVar100 * auVar91._8_4_;
      auVar122._12_4_ = fVar101 * auVar91._12_4_;
      auVar91 = vpmaxsd_avx(auVar86,auVar186._0_16_);
      auVar72 = vpmaxsd_avx(auVar72,auVar91);
      auVar91 = vpminsd_avx(auVar122,auVar188._0_16_);
      auVar91 = vpminsd_avx(auVar92,auVar91);
      auVar72 = vpcmpgtd_avx(auVar72,auVar91);
      iVar52 = vmovmskps_avx(auVar72);
      if (iVar52 == 0xf) {
        bVar70 = local_c18 != &local_800;
        goto joined_r0x003548e0;
      }
      bVar51 = (byte)iVar52 ^ 0xf;
      uVar68 = uVar66 & 0xfffffffffffffff0;
      lVar55 = 0;
      if (bVar51 != 0) {
        for (; (bVar51 >> lVar55 & 1) == 0; lVar55 = lVar55 + 1) {
        }
      }
      uVar66 = *(ulong *)(uVar68 + lVar55 * 8);
      uVar56 = bVar51 - 1 & (uint)bVar51;
      if (uVar56 != 0) {
        *local_c18 = uVar66;
        local_c18 = local_c18 + 1;
        lVar55 = 0;
        if (uVar56 != 0) {
          for (; (uVar56 >> lVar55 & 1) == 0; lVar55 = lVar55 + 1) {
          }
        }
        uVar66 = *(ulong *)(uVar68 + lVar55 * 8);
        uVar56 = uVar56 - 1 & uVar56;
        uVar54 = (ulong)uVar56;
        if (uVar56 != 0) {
          do {
            *local_c18 = uVar66;
            local_c18 = local_c18 + 1;
            lVar55 = 0;
            if (uVar54 != 0) {
              for (; (uVar54 >> lVar55 & 1) == 0; lVar55 = lVar55 + 1) {
              }
            }
            uVar66 = *(ulong *)(uVar68 + lVar55 * 8);
            uVar54 = uVar54 & uVar54 - 1;
          } while (uVar54 != 0);
        }
      }
    }
    local_be0 = (ulong)((uint)uVar66 & 0xf) - 8;
    if (local_be0 != 0) {
      uVar66 = uVar66 & 0xfffffffffffffff0;
      local_bd8 = 0;
      do {
        lVar55 = local_bd8 * 0x58;
        local_bb8 = uVar66 + lVar55;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = *(ulong *)(uVar66 + 0x20 + lVar55);
        auVar87._8_8_ = 0;
        auVar87._0_8_ = *(ulong *)(uVar66 + 0x24 + lVar55);
        auVar91 = vpminub_avx(auVar72,auVar87);
        auVar72 = vpcmpeqb_avx(auVar72,auVar91);
        auVar91 = vpcmpeqd_avx(auVar91,auVar91);
        auVar72 = vpmovzxbd_avx(auVar72 ^ auVar91);
        auVar72 = vpslld_avx(auVar72 ^ auVar91,0x1f);
        uVar50 = vmovmskps_avx(auVar72);
        fVar102 = *(float *)(uVar66 + 0x38 + lVar55);
        fVar103 = *(float *)(uVar66 + 0x44 + lVar55);
        auVar107._8_8_ = 0;
        auVar107._0_8_ = *(ulong *)(local_be8 + 0x20 + local_bb8);
        auVar72 = vpmovzxbd_avx(auVar107);
        auVar72 = vcvtdq2ps_avx(auVar72);
        auVar108._0_4_ = fVar102 + fVar103 * auVar72._0_4_;
        auVar108._4_4_ = fVar102 + fVar103 * auVar72._4_4_;
        auVar108._8_4_ = fVar102 + fVar103 * auVar72._8_4_;
        auVar108._12_4_ = fVar102 + fVar103 * auVar72._12_4_;
        auVar123._8_8_ = 0;
        auVar123._0_8_ = *(ulong *)(local_bf0 + 0x20 + local_bb8);
        auVar72 = vpmovzxbd_avx(auVar123);
        auVar72 = vcvtdq2ps_avx(auVar72);
        auVar73._0_4_ = fVar102 + fVar103 * auVar72._0_4_;
        auVar73._4_4_ = fVar102 + fVar103 * auVar72._4_4_;
        auVar73._8_4_ = fVar102 + fVar103 * auVar72._8_4_;
        auVar73._12_4_ = fVar102 + fVar103 * auVar72._12_4_;
        fVar102 = *(float *)(uVar66 + 0x3c + lVar55);
        fVar103 = *(float *)(uVar66 + 0x48 + lVar55);
        auVar126._8_8_ = 0;
        auVar126._0_8_ = *(ulong *)(local_bf8 + 0x20 + local_bb8);
        auVar72 = vpmovzxbd_avx(auVar126);
        auVar72 = vcvtdq2ps_avx(auVar72);
        auVar127._0_4_ = fVar102 + fVar103 * auVar72._0_4_;
        auVar127._4_4_ = fVar102 + fVar103 * auVar72._4_4_;
        auVar127._8_4_ = fVar102 + fVar103 * auVar72._8_4_;
        auVar127._12_4_ = fVar102 + fVar103 * auVar72._12_4_;
        auVar132._8_8_ = 0;
        auVar132._0_8_ = *(ulong *)(local_c00 + 0x20 + local_bb8);
        auVar72 = vpmovzxbd_avx(auVar132);
        auVar72 = vcvtdq2ps_avx(auVar72);
        auVar88._0_4_ = fVar102 + fVar103 * auVar72._0_4_;
        auVar88._4_4_ = fVar102 + fVar103 * auVar72._4_4_;
        auVar88._8_4_ = fVar102 + fVar103 * auVar72._8_4_;
        auVar88._12_4_ = fVar102 + fVar103 * auVar72._12_4_;
        fVar102 = *(float *)(uVar66 + 0x4c + lVar55);
        auVar133._8_8_ = 0;
        auVar133._0_8_ = *(ulong *)(local_c08 + 0x20 + local_bb8);
        auVar72 = vpmovzxbd_avx(auVar133);
        auVar72 = vcvtdq2ps_avx(auVar72);
        auVar136._8_8_ = 0;
        auVar136._0_8_ = *(ulong *)(local_c10 + 0x20 + local_bb8);
        auVar91 = vpmovzxbd_avx(auVar136);
        auVar91 = vcvtdq2ps_avx(auVar91);
        fVar103 = *(float *)(uVar66 + 0x40 + lVar55);
        auVar134._0_4_ = fVar103 + fVar102 * auVar72._0_4_;
        auVar134._4_4_ = fVar103 + fVar102 * auVar72._4_4_;
        auVar134._8_4_ = fVar103 + fVar102 * auVar72._8_4_;
        auVar134._12_4_ = fVar103 + fVar102 * auVar72._12_4_;
        auVar124._0_4_ = fVar103 + fVar102 * auVar91._0_4_;
        auVar124._4_4_ = fVar103 + fVar102 * auVar91._4_4_;
        auVar124._8_4_ = fVar103 + fVar102 * auVar91._8_4_;
        auVar124._12_4_ = fVar103 + fVar102 * auVar91._12_4_;
        auVar72 = vsubps_avx(auVar108,auVar141._0_16_);
        auVar109._0_4_ = fVar85 * auVar72._0_4_;
        auVar109._4_4_ = fVar80 * auVar72._4_4_;
        auVar109._8_4_ = fVar82 * auVar72._8_4_;
        auVar109._12_4_ = fVar84 * auVar72._12_4_;
        auVar72 = vsubps_avx(auVar127,auVar144._0_16_);
        auVar128._0_4_ = fVar78 * auVar72._0_4_;
        auVar128._4_4_ = fVar81 * auVar72._4_4_;
        auVar128._8_4_ = fVar83 * auVar72._8_4_;
        auVar128._12_4_ = fVar98 * auVar72._12_4_;
        auVar72 = vpmaxsd_avx(auVar109,auVar128);
        auVar91 = vsubps_avx(auVar73,auVar141._0_16_);
        auVar74._0_4_ = fVar85 * auVar91._0_4_;
        auVar74._4_4_ = fVar80 * auVar91._4_4_;
        auVar74._8_4_ = fVar82 * auVar91._8_4_;
        auVar74._12_4_ = fVar84 * auVar91._12_4_;
        auVar91 = vsubps_avx(auVar88,auVar144._0_16_);
        auVar89._0_4_ = fVar78 * auVar91._0_4_;
        auVar89._4_4_ = fVar81 * auVar91._4_4_;
        auVar89._8_4_ = fVar83 * auVar91._8_4_;
        auVar89._12_4_ = fVar98 * auVar91._12_4_;
        auVar92 = vpminsd_avx(auVar74,auVar89);
        auVar91 = vsubps_avx(auVar134,auVar154._0_16_);
        auVar90._0_4_ = fVar79 * auVar91._0_4_;
        auVar90._4_4_ = fVar99 * auVar91._4_4_;
        auVar90._8_4_ = fVar100 * auVar91._8_4_;
        auVar90._12_4_ = fVar101 * auVar91._12_4_;
        auVar91 = vpmaxsd_avx(auVar90,auVar186._0_16_);
        auVar72 = vpmaxsd_avx(auVar72,auVar91);
        auVar91 = vsubps_avx(auVar124,auVar154._0_16_);
        auVar110._0_4_ = fVar79 * auVar91._0_4_;
        auVar110._4_4_ = fVar99 * auVar91._4_4_;
        auVar110._8_4_ = fVar100 * auVar91._8_4_;
        auVar110._12_4_ = fVar101 * auVar91._12_4_;
        auVar91 = vpminsd_avx(auVar110,auVar188._0_16_);
        auVar91 = vpminsd_avx(auVar92,auVar91);
        auVar72 = vpcmpgtd_avx(auVar72,auVar91);
        uVar53 = vmovmskps_avx(auVar72);
        bVar51 = ~(byte)uVar53 & (byte)uVar50;
        if (bVar51 != 0) {
          uVar57 = (ulong)bVar51;
          do {
            lVar55 = 0;
            if (uVar57 != 0) {
              for (; (uVar57 >> lVar55 & 1) == 0; lVar55 = lVar55 + 1) {
              }
            }
            uVar2 = *(ushort *)(local_bb8 + lVar55 * 8);
            uVar3 = *(ushort *)(local_bb8 + 2 + lVar55 * 8);
            local_bc8 = (ulong)*(uint *)(local_bb8 + 0x50);
            uVar56 = *(uint *)(local_bb8 + 4 + lVar55 * 8);
            local_bd0 = (ulong)uVar56;
            pGVar4 = (context->scene->geometries).items[local_bc8].ptr;
            local_bc0 = *(long *)&pGVar4->field_0x58;
            lVar59 = pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                     local_bd0;
            uVar60 = uVar2 & 0x7fff;
            uVar61 = uVar3 & 0x7fff;
            uVar152 = *(uint *)(local_bc0 + 4 + lVar59);
            uVar64 = (ulong)uVar152;
            uVar63 = (ulong)(uVar152 * uVar61 + *(int *)(local_bc0 + lVar59) + uVar60);
            p_Var5 = pGVar4[1].intersectionFilterN;
            lVar55 = *(long *)&pGVar4[1].time_range.upper;
            auVar72 = *(undefined1 (*) [16])(lVar55 + (long)p_Var5 * uVar63);
            auVar91 = *(undefined1 (*) [16])(lVar55 + (uVar63 + 1) * (long)p_Var5);
            auVar92 = *(undefined1 (*) [16])(lVar55 + (uVar63 + uVar64) * (long)p_Var5);
            lVar69 = uVar63 + uVar64 + 1;
            auVar86 = *(undefined1 (*) [16])(lVar55 + lVar69 * (long)p_Var5);
            uVar62 = (ulong)(-1 < (short)uVar2);
            auVar106 = *(undefined1 (*) [16])(lVar55 + (uVar63 + uVar62 + 1) * (long)p_Var5);
            lVar58 = uVar62 + lVar69;
            auVar121 = *(undefined1 (*) [16])(lVar55 + lVar58 * (long)p_Var5);
            uVar62 = 0;
            if (-1 < (short)uVar3) {
              uVar62 = uVar64;
            }
            auVar122 = *(undefined1 (*) [16])(lVar55 + (uVar63 + uVar64 + uVar62) * (long)p_Var5);
            auVar73 = *(undefined1 (*) [16])(lVar55 + (lVar69 + uVar62) * (long)p_Var5);
            auVar74 = *(undefined1 (*) [16])(lVar55 + (uVar62 + lVar58) * (long)p_Var5);
            auVar88 = vunpcklps_avx(auVar72,auVar86);
            auVar72 = vunpckhps_avx(auVar72,auVar86);
            auVar89 = vunpcklps_avx(auVar91,auVar92);
            auVar87 = vunpckhps_avx(auVar91,auVar92);
            auVar87 = vunpcklps_avx(auVar72,auVar87);
            auVar90 = vunpcklps_avx(auVar88,auVar89);
            auVar72 = vunpckhps_avx(auVar88,auVar89);
            auVar88 = vunpcklps_avx(auVar91,auVar121);
            auVar91 = vunpckhps_avx(auVar91,auVar121);
            auVar89 = vunpcklps_avx(auVar106,auVar86);
            auVar106 = vunpckhps_avx(auVar106,auVar86);
            auVar107 = vunpcklps_avx(auVar91,auVar106);
            auVar108 = vunpcklps_avx(auVar88,auVar89);
            auVar91 = vunpckhps_avx(auVar88,auVar89);
            auVar88 = vunpcklps_avx(auVar86,auVar74);
            auVar106 = vunpckhps_avx(auVar86,auVar74);
            auVar74 = vunpcklps_avx(auVar121,auVar73);
            auVar121 = vunpckhps_avx(auVar121,auVar73);
            auVar121 = vunpcklps_avx(auVar106,auVar121);
            auVar89 = vunpcklps_avx(auVar88,auVar74);
            auVar106 = vunpckhps_avx(auVar88,auVar74);
            auVar74 = vunpcklps_avx(auVar92,auVar73);
            auVar92 = vunpckhps_avx(auVar92,auVar73);
            auVar73 = vunpcklps_avx(auVar86,auVar122);
            auVar86 = vunpckhps_avx(auVar86,auVar122);
            auVar86 = vunpcklps_avx(auVar92,auVar86);
            auVar122 = vunpcklps_avx(auVar74,auVar73);
            auVar92 = vunpckhps_avx(auVar74,auVar73);
            auVar125._16_16_ = auVar89;
            auVar125._0_16_ = auVar90;
            auVar135._16_16_ = auVar106;
            auVar135._0_16_ = auVar72;
            auVar143._16_16_ = auVar121;
            auVar143._0_16_ = auVar87;
            auVar130._16_16_ = auVar108;
            auVar130._0_16_ = auVar108;
            auVar139._16_16_ = auVar91;
            auVar139._0_16_ = auVar91;
            auVar113._16_16_ = auVar107;
            auVar113._0_16_ = auVar107;
            auVar94._16_16_ = auVar122;
            auVar94._0_16_ = auVar122;
            auVar169._16_16_ = auVar92;
            auVar169._0_16_ = auVar92;
            auVar177._16_16_ = auVar86;
            auVar177._0_16_ = auVar86;
            auVar130 = vsubps_avx(auVar125,auVar130);
            auVar75 = vsubps_avx(auVar135,auVar139);
            auVar112 = vsubps_avx(auVar143,auVar113);
            auVar76 = vsubps_avx(auVar94,auVar125);
            auVar94 = vsubps_avx(auVar169,auVar135);
            auVar96 = vsubps_avx(auVar177,auVar143);
            fVar80 = auVar75._0_4_;
            fVar176 = auVar96._0_4_;
            fVar100 = auVar75._4_4_;
            fVar178 = auVar96._4_4_;
            auVar34._4_4_ = fVar178 * fVar100;
            auVar34._0_4_ = fVar176 * fVar80;
            fVar116 = auVar75._8_4_;
            fVar179 = auVar96._8_4_;
            auVar34._8_4_ = fVar179 * fVar116;
            fVar6 = auVar75._12_4_;
            fVar180 = auVar96._12_4_;
            auVar34._12_4_ = fVar180 * fVar6;
            fVar13 = auVar75._16_4_;
            fVar181 = auVar96._16_4_;
            auVar34._16_4_ = fVar181 * fVar13;
            fVar20 = auVar75._20_4_;
            fVar182 = auVar96._20_4_;
            auVar34._20_4_ = fVar182 * fVar20;
            fVar27 = auVar75._24_4_;
            fVar183 = auVar96._24_4_;
            auVar34._24_4_ = fVar183 * fVar27;
            auVar34._28_4_ = auVar122._12_4_;
            fVar82 = auVar112._0_4_;
            fVar168 = auVar94._0_4_;
            fVar101 = auVar112._4_4_;
            fVar170 = auVar94._4_4_;
            auVar35._4_4_ = fVar170 * fVar101;
            auVar35._0_4_ = fVar168 * fVar82;
            fVar117 = auVar112._8_4_;
            fVar171 = auVar94._8_4_;
            auVar35._8_4_ = fVar171 * fVar117;
            fVar7 = auVar112._12_4_;
            fVar172 = auVar94._12_4_;
            auVar35._12_4_ = fVar172 * fVar7;
            fVar14 = auVar112._16_4_;
            fVar173 = auVar94._16_4_;
            auVar35._16_4_ = fVar173 * fVar14;
            fVar21 = auVar112._20_4_;
            fVar174 = auVar94._20_4_;
            auVar35._20_4_ = fVar174 * fVar21;
            fVar28 = auVar112._24_4_;
            uVar39 = auVar107._12_4_;
            fVar175 = auVar94._24_4_;
            auVar35._24_4_ = fVar175 * fVar28;
            auVar35._28_4_ = uVar39;
            auVar34 = vsubps_avx(auVar35,auVar34);
            fVar151 = auVar76._0_4_;
            fVar155 = auVar76._4_4_;
            auVar36._4_4_ = fVar155 * fVar101;
            auVar36._0_4_ = fVar151 * fVar82;
            fVar157 = auVar76._8_4_;
            auVar36._8_4_ = fVar157 * fVar117;
            fVar159 = auVar76._12_4_;
            auVar36._12_4_ = fVar159 * fVar7;
            fVar161 = auVar76._16_4_;
            auVar36._16_4_ = fVar161 * fVar14;
            fVar163 = auVar76._20_4_;
            auVar36._20_4_ = fVar163 * fVar21;
            fVar165 = auVar76._24_4_;
            auVar36._24_4_ = fVar165 * fVar28;
            auVar36._28_4_ = uVar39;
            fVar84 = auVar130._0_4_;
            fVar102 = auVar130._4_4_;
            auVar37._4_4_ = fVar178 * fVar102;
            auVar37._0_4_ = fVar176 * fVar84;
            fVar118 = auVar130._8_4_;
            auVar37._8_4_ = fVar179 * fVar118;
            fVar8 = auVar130._12_4_;
            auVar37._12_4_ = fVar180 * fVar8;
            fVar15 = auVar130._16_4_;
            auVar37._16_4_ = fVar181 * fVar15;
            fVar22 = auVar130._20_4_;
            auVar37._20_4_ = fVar182 * fVar22;
            fVar29 = auVar130._24_4_;
            uVar40 = auVar108._12_4_;
            auVar37._24_4_ = fVar183 * fVar29;
            auVar37._28_4_ = uVar40;
            auVar35 = vsubps_avx(auVar37,auVar36);
            auVar38._4_4_ = fVar170 * fVar102;
            auVar38._0_4_ = fVar168 * fVar84;
            auVar38._8_4_ = fVar171 * fVar118;
            auVar38._12_4_ = fVar172 * fVar8;
            auVar38._16_4_ = fVar173 * fVar15;
            auVar38._20_4_ = fVar174 * fVar22;
            auVar38._24_4_ = fVar175 * fVar29;
            auVar38._28_4_ = uVar40;
            auVar184._0_4_ = fVar151 * fVar80;
            auVar184._4_4_ = fVar155 * fVar100;
            auVar184._8_4_ = fVar157 * fVar116;
            auVar184._12_4_ = fVar159 * fVar6;
            auVar184._16_4_ = fVar161 * fVar13;
            auVar184._20_4_ = fVar163 * fVar20;
            auVar184._24_4_ = fVar165 * fVar27;
            auVar184._28_4_ = 0;
            uVar50 = *(undefined4 *)(ray + k * 4);
            auVar185._4_4_ = uVar50;
            auVar185._0_4_ = uVar50;
            auVar185._8_4_ = uVar50;
            auVar185._12_4_ = uVar50;
            auVar185._16_4_ = uVar50;
            auVar185._20_4_ = uVar50;
            auVar185._24_4_ = uVar50;
            auVar185._28_4_ = uVar50;
            uVar53 = *(undefined4 *)(ray + k * 4 + 0x10);
            auVar187._4_4_ = uVar53;
            auVar187._0_4_ = uVar53;
            auVar187._8_4_ = uVar53;
            auVar187._12_4_ = uVar53;
            auVar187._16_4_ = uVar53;
            auVar187._20_4_ = uVar53;
            auVar187._24_4_ = uVar53;
            auVar187._28_4_ = uVar53;
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
            auVar190._4_4_ = uVar1;
            auVar190._0_4_ = uVar1;
            auVar190._8_4_ = uVar1;
            auVar190._12_4_ = uVar1;
            auVar190._16_4_ = uVar1;
            auVar190._20_4_ = uVar1;
            auVar190._24_4_ = uVar1;
            auVar190._28_4_ = uVar1;
            fVar85 = *(float *)(ray + k * 4 + 0x50);
            local_aa0 = vsubps_avx(auVar184,auVar38);
            auVar36 = vsubps_avx(auVar125,auVar185);
            fVar78 = *(float *)(ray + k * 4 + 0x60);
            auVar75 = vsubps_avx(auVar135,auVar187);
            auVar112 = vsubps_avx(auVar143,auVar190);
            fVar142 = auVar112._0_4_;
            fVar145 = auVar112._4_4_;
            auVar41._4_4_ = fVar145 * fVar85;
            auVar41._0_4_ = fVar142 * fVar85;
            fVar146 = auVar112._8_4_;
            auVar41._8_4_ = fVar146 * fVar85;
            fVar147 = auVar112._12_4_;
            auVar41._12_4_ = fVar147 * fVar85;
            fVar148 = auVar112._16_4_;
            auVar41._16_4_ = fVar148 * fVar85;
            fVar149 = auVar112._20_4_;
            auVar41._20_4_ = fVar149 * fVar85;
            fVar150 = auVar112._24_4_;
            auVar41._24_4_ = fVar150 * fVar85;
            auVar41._28_4_ = uVar50;
            fVar81 = auVar75._0_4_;
            fVar103 = auVar75._4_4_;
            auVar42._4_4_ = fVar78 * fVar103;
            auVar42._0_4_ = fVar78 * fVar81;
            fVar119 = auVar75._8_4_;
            auVar42._8_4_ = fVar78 * fVar119;
            fVar9 = auVar75._12_4_;
            auVar42._12_4_ = fVar78 * fVar9;
            fVar16 = auVar75._16_4_;
            auVar42._16_4_ = fVar78 * fVar16;
            fVar23 = auVar75._20_4_;
            auVar42._20_4_ = fVar78 * fVar23;
            fVar30 = auVar75._24_4_;
            auVar42._24_4_ = fVar78 * fVar30;
            auVar42._28_4_ = uVar53;
            auVar37 = vsubps_avx(auVar42,auVar41);
            fVar79 = *(float *)(ray + k * 4 + 0x40);
            fVar83 = auVar36._0_4_;
            fVar104 = auVar36._4_4_;
            auVar43._4_4_ = fVar78 * fVar104;
            auVar43._0_4_ = fVar78 * fVar83;
            fVar120 = auVar36._8_4_;
            auVar43._8_4_ = fVar78 * fVar120;
            fVar10 = auVar36._12_4_;
            auVar43._12_4_ = fVar78 * fVar10;
            fVar17 = auVar36._16_4_;
            auVar43._16_4_ = fVar78 * fVar17;
            fVar24 = auVar36._20_4_;
            auVar43._20_4_ = fVar78 * fVar24;
            fVar31 = auVar36._24_4_;
            auVar43._24_4_ = fVar78 * fVar31;
            auVar43._28_4_ = uVar1;
            auVar44._4_4_ = fVar145 * fVar79;
            auVar44._0_4_ = fVar142 * fVar79;
            auVar44._8_4_ = fVar146 * fVar79;
            auVar44._12_4_ = fVar147 * fVar79;
            auVar44._16_4_ = fVar148 * fVar79;
            auVar44._20_4_ = fVar149 * fVar79;
            auVar44._24_4_ = fVar150 * fVar79;
            auVar44._28_4_ = uVar39;
            auVar112 = vsubps_avx(auVar44,auVar43);
            auVar45._4_4_ = fVar79 * fVar103;
            auVar45._0_4_ = fVar79 * fVar81;
            auVar45._8_4_ = fVar79 * fVar119;
            auVar45._12_4_ = fVar79 * fVar9;
            auVar45._16_4_ = fVar79 * fVar16;
            auVar45._20_4_ = fVar79 * fVar23;
            auVar45._24_4_ = fVar79 * fVar30;
            auVar45._28_4_ = uVar1;
            auVar46._4_4_ = fVar104 * fVar85;
            auVar46._0_4_ = fVar83 * fVar85;
            auVar46._8_4_ = fVar120 * fVar85;
            auVar46._12_4_ = fVar10 * fVar85;
            auVar46._16_4_ = fVar17 * fVar85;
            auVar46._20_4_ = fVar24 * fVar85;
            auVar46._24_4_ = fVar31 * fVar85;
            auVar46._28_4_ = uVar40;
            auVar38 = vsubps_avx(auVar46,auVar45);
            fVar98 = local_aa0._0_4_;
            fVar105 = local_aa0._4_4_;
            fVar71 = local_aa0._8_4_;
            fVar11 = local_aa0._12_4_;
            fVar18 = local_aa0._16_4_;
            fVar25 = local_aa0._20_4_;
            fVar32 = local_aa0._24_4_;
            fVar189 = auVar35._0_4_;
            fVar191 = auVar35._4_4_;
            fVar192 = auVar35._8_4_;
            fVar193 = auVar35._12_4_;
            fVar194 = auVar35._16_4_;
            fVar195 = auVar35._20_4_;
            fVar196 = auVar35._24_4_;
            fVar99 = auVar34._0_4_;
            fVar115 = auVar34._4_4_;
            fVar77 = auVar34._8_4_;
            fVar12 = auVar34._12_4_;
            fVar19 = auVar34._16_4_;
            fVar26 = auVar34._20_4_;
            fVar33 = auVar34._24_4_;
            auVar95._0_4_ = fVar79 * fVar99 + fVar78 * fVar98 + fVar189 * fVar85;
            auVar95._4_4_ = fVar79 * fVar115 + fVar78 * fVar105 + fVar191 * fVar85;
            auVar95._8_4_ = fVar79 * fVar77 + fVar78 * fVar71 + fVar192 * fVar85;
            auVar95._12_4_ = fVar79 * fVar12 + fVar78 * fVar11 + fVar193 * fVar85;
            auVar95._16_4_ = fVar79 * fVar19 + fVar78 * fVar18 + fVar194 * fVar85;
            auVar95._20_4_ = fVar79 * fVar26 + fVar78 * fVar25 + fVar195 * fVar85;
            auVar95._24_4_ = fVar79 * fVar33 + fVar78 * fVar32 + fVar196 * fVar85;
            auVar95._28_4_ = fVar78 + fVar78 + fVar85;
            auVar131._8_4_ = 0x80000000;
            auVar131._0_8_ = 0x8000000080000000;
            auVar131._12_4_ = 0x80000000;
            auVar131._16_4_ = 0x80000000;
            auVar131._20_4_ = 0x80000000;
            auVar131._24_4_ = 0x80000000;
            auVar131._28_4_ = 0x80000000;
            auVar75 = vandps_avx(auVar95,auVar131);
            uVar152 = auVar75._0_4_;
            auVar137._0_4_ =
                 (float)(uVar152 ^
                        (uint)(fVar151 * auVar37._0_4_ +
                              fVar176 * auVar38._0_4_ + fVar168 * auVar112._0_4_));
            uVar156 = auVar75._4_4_;
            auVar137._4_4_ =
                 (float)(uVar156 ^
                        (uint)(fVar155 * auVar37._4_4_ +
                              fVar178 * auVar38._4_4_ + fVar170 * auVar112._4_4_));
            uVar158 = auVar75._8_4_;
            auVar137._8_4_ =
                 (float)(uVar158 ^
                        (uint)(fVar157 * auVar37._8_4_ +
                              fVar179 * auVar38._8_4_ + fVar171 * auVar112._8_4_));
            uVar160 = auVar75._12_4_;
            auVar137._12_4_ =
                 (float)(uVar160 ^
                        (uint)(fVar159 * auVar37._12_4_ +
                              fVar180 * auVar38._12_4_ + fVar172 * auVar112._12_4_));
            uVar162 = auVar75._16_4_;
            auVar137._16_4_ =
                 (float)(uVar162 ^
                        (uint)(fVar161 * auVar37._16_4_ +
                              fVar181 * auVar38._16_4_ + fVar173 * auVar112._16_4_));
            uVar164 = auVar75._20_4_;
            auVar137._20_4_ =
                 (float)(uVar164 ^
                        (uint)(fVar163 * auVar37._20_4_ +
                              fVar182 * auVar38._20_4_ + fVar174 * auVar112._20_4_));
            uVar166 = auVar75._24_4_;
            auVar137._24_4_ =
                 (float)(uVar166 ^
                        (uint)(fVar165 * auVar37._24_4_ +
                              fVar183 * auVar38._24_4_ + fVar175 * auVar112._24_4_));
            uVar167 = auVar75._28_4_;
            auVar137._28_4_ =
                 (float)(uVar167 ^ (uint)(auVar76._28_4_ + auVar96._28_4_ + auVar94._28_4_));
            auVar140._0_4_ =
                 (float)(uVar152 ^
                        (uint)(auVar37._0_4_ * fVar84 +
                              fVar82 * auVar38._0_4_ + fVar80 * auVar112._0_4_));
            auVar140._4_4_ =
                 (float)(uVar156 ^
                        (uint)(auVar37._4_4_ * fVar102 +
                              fVar101 * auVar38._4_4_ + fVar100 * auVar112._4_4_));
            auVar140._8_4_ =
                 (float)(uVar158 ^
                        (uint)(auVar37._8_4_ * fVar118 +
                              fVar117 * auVar38._8_4_ + fVar116 * auVar112._8_4_));
            auVar140._12_4_ =
                 (float)(uVar160 ^
                        (uint)(auVar37._12_4_ * fVar8 +
                              fVar7 * auVar38._12_4_ + fVar6 * auVar112._12_4_));
            auVar140._16_4_ =
                 (float)(uVar162 ^
                        (uint)(auVar37._16_4_ * fVar15 +
                              fVar14 * auVar38._16_4_ + fVar13 * auVar112._16_4_));
            auVar140._20_4_ =
                 (float)(uVar164 ^
                        (uint)(auVar37._20_4_ * fVar22 +
                              fVar21 * auVar38._20_4_ + fVar20 * auVar112._20_4_));
            auVar140._24_4_ =
                 (float)(uVar166 ^
                        (uint)(auVar37._24_4_ * fVar29 +
                              fVar28 * auVar38._24_4_ + fVar27 * auVar112._24_4_));
            auVar140._28_4_ =
                 (float)(uVar167 ^ (uint)(auVar34._28_4_ + auVar38._28_4_ + auVar112._28_4_));
            auVar112 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar75 = vcmpps_avx(auVar137,auVar112,5);
            auVar112 = vcmpps_avx(auVar140,auVar112,5);
            auVar75 = vandps_avx(auVar75,auVar112);
            auVar76._8_4_ = 0x7fffffff;
            auVar76._0_8_ = 0x7fffffff7fffffff;
            auVar76._12_4_ = 0x7fffffff;
            auVar76._16_4_ = 0x7fffffff;
            auVar76._20_4_ = 0x7fffffff;
            auVar76._24_4_ = 0x7fffffff;
            auVar76._28_4_ = 0x7fffffff;
            local_920 = vandps_avx(auVar95,auVar76);
            auVar112 = vcmpps_avx(auVar95,ZEXT1232(ZEXT812(0)) << 0x20,4);
            auVar75 = vandps_avx(auVar75,auVar112);
            auVar96._0_4_ = auVar137._0_4_ + auVar140._0_4_;
            auVar96._4_4_ = auVar137._4_4_ + auVar140._4_4_;
            auVar96._8_4_ = auVar137._8_4_ + auVar140._8_4_;
            auVar96._12_4_ = auVar137._12_4_ + auVar140._12_4_;
            auVar96._16_4_ = auVar137._16_4_ + auVar140._16_4_;
            auVar96._20_4_ = auVar137._20_4_ + auVar140._20_4_;
            auVar96._24_4_ = auVar137._24_4_ + auVar140._24_4_;
            auVar96._28_4_ = auVar137._28_4_ + auVar140._28_4_;
            auVar112 = vcmpps_avx(auVar96,local_920,2);
            auVar76 = auVar112 & auVar75;
            if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar76 >> 0x7f,0) != '\0') ||
                  (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar76 >> 0xbf,0) != '\0') ||
                (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar76[0x1f] < '\0') {
              auVar75 = vandps_avx(auVar75,auVar112);
              auVar72 = vpackssdw_avx(auVar75._0_16_,auVar75._16_16_);
              local_940._0_4_ =
                   (float)(uVar152 ^ (uint)(fVar99 * fVar83 + fVar189 * fVar81 + fVar142 * fVar98));
              local_940._4_4_ =
                   (float)(uVar156 ^
                          (uint)(fVar115 * fVar104 + fVar191 * fVar103 + fVar145 * fVar105));
              local_940._8_4_ =
                   (float)(uVar158 ^ (uint)(fVar77 * fVar120 + fVar192 * fVar119 + fVar146 * fVar71)
                          );
              local_940._12_4_ =
                   (float)(uVar160 ^ (uint)(fVar12 * fVar10 + fVar193 * fVar9 + fVar147 * fVar11));
              local_940._16_4_ =
                   (float)(uVar162 ^ (uint)(fVar19 * fVar17 + fVar194 * fVar16 + fVar148 * fVar18));
              local_940._20_4_ =
                   (float)(uVar164 ^ (uint)(fVar26 * fVar24 + fVar195 * fVar23 + fVar149 * fVar25));
              local_940._24_4_ =
                   (float)(uVar166 ^ (uint)(fVar33 * fVar31 + fVar196 * fVar30 + fVar150 * fVar32));
              local_940._28_4_ = uVar167 ^ (uint)(auVar36._28_4_ + 0.0);
              fVar85 = *(float *)(ray + k * 4 + 0x30);
              fVar78 = local_920._0_4_;
              fVar79 = local_920._4_4_;
              auVar47._4_4_ = fVar79 * fVar85;
              auVar47._0_4_ = fVar78 * fVar85;
              fVar80 = local_920._8_4_;
              auVar47._8_4_ = fVar80 * fVar85;
              fVar82 = local_920._12_4_;
              auVar47._12_4_ = fVar82 * fVar85;
              fVar84 = local_920._16_4_;
              auVar47._16_4_ = fVar84 * fVar85;
              fVar81 = local_920._20_4_;
              auVar47._20_4_ = fVar81 * fVar85;
              fVar83 = local_920._24_4_;
              auVar47._24_4_ = fVar83 * fVar85;
              auVar47._28_4_ = fVar85;
              auVar75 = vcmpps_avx(auVar47,local_940,1);
              local_9e0 = *(float *)(ray + k * 4 + 0x80);
              auVar48._4_4_ = local_9e0 * fVar79;
              auVar48._0_4_ = local_9e0 * fVar78;
              auVar48._8_4_ = local_9e0 * fVar80;
              auVar48._12_4_ = local_9e0 * fVar82;
              auVar48._16_4_ = local_9e0 * fVar84;
              auVar48._20_4_ = local_9e0 * fVar81;
              auVar48._24_4_ = local_9e0 * fVar83;
              auVar48._28_4_ = 0;
              auVar112 = vcmpps_avx(local_940,auVar48,2);
              auVar75 = vandps_avx(auVar75,auVar112);
              auVar91 = vpackssdw_avx(auVar75._0_16_,auVar75._16_16_);
              auVar72 = vpand_avx(auVar91,auVar72);
              auVar91 = vpmovzxwd_avx(auVar72);
              auVar91 = vpslld_avx(auVar91,0x1f);
              auVar92 = vpsrad_avx(auVar91,0x1f);
              auVar91 = vpunpckhwd_avx(auVar72,auVar72);
              auVar91 = vpslld_avx(auVar91,0x1f);
              auVar91 = vpsrad_avx(auVar91,0x1f);
              local_8e0._16_16_ = auVar91;
              local_8e0._0_16_ = auVar92;
              if ((((((((local_8e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_8e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_8e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_8e0 >> 0x7f,0) != '\0') ||
                    (local_8e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar91 >> 0x3f,0) != '\0') ||
                  (local_8e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar91[0xf] < '\0') {
                auVar75 = vsubps_avx(local_920,auVar140);
                auVar75 = vblendvps_avx(auVar137,auVar75,local_9a0);
                auVar76 = vsubps_avx(local_920,auVar137);
                auVar112 = vblendvps_avx(auVar140,auVar76,local_9a0);
                uStack_844 = auVar76._28_4_;
                local_860[0] = fVar99 * (float)local_9c0._0_4_;
                local_860[1] = fVar115 * (float)local_9c0._4_4_;
                local_860[2] = fVar77 * fStack_9b8;
                local_860[3] = fVar12 * fStack_9b4;
                fStack_850 = fVar19 * fStack_9b0;
                fStack_84c = fVar26 * fStack_9ac;
                fStack_848 = fVar33 * fStack_9a8;
                local_840[0] = fVar189 * (float)local_9c0._0_4_;
                local_840[1] = fVar191 * (float)local_9c0._4_4_;
                local_840[2] = fVar192 * fStack_9b8;
                local_840[3] = fVar193 * fStack_9b4;
                fStack_830 = fVar194 * fStack_9b0;
                fStack_82c = fVar195 * fStack_9ac;
                fStack_828 = fVar196 * fStack_9a8;
                uStack_824 = uStack_844;
                local_820[0] = (float)local_9c0._0_4_ * fVar98;
                local_820[1] = (float)local_9c0._4_4_ * fVar105;
                local_820[2] = fStack_9b8 * fVar71;
                local_820[3] = fStack_9b4 * fVar11;
                fStack_810 = fStack_9b0 * fVar18;
                fStack_80c = fStack_9ac * fVar25;
                fStack_808 = fStack_9a8 * fVar32;
                uStack_804 = uStack_844;
                auVar91 = vpshufd_avx(ZEXT416(uVar60),0);
                auVar91 = vpaddd_avx(auVar91,_DAT_01fab9b0);
                auVar92 = vpshufd_avx(ZEXT416(uVar61),0);
                auVar92 = vpaddd_avx(auVar92,_DAT_01fab9c0);
                auVar129._0_4_ = (float)(int)(*(ushort *)(local_bc0 + 8 + lVar59) - 1);
                auVar129._4_12_ = auVar37._4_12_;
                auVar86 = vrcpss_avx(auVar129,auVar129);
                auVar153._0_4_ = (float)(int)(*(ushort *)(local_bc0 + 10 + lVar59) - 1);
                auVar153._4_12_ = auVar37._4_12_;
                auVar106 = vrcpss_avx(auVar153,auVar153);
                auVar97._16_16_ = auVar91;
                auVar97._0_16_ = auVar91;
                auVar76 = vcvtdq2ps_avx(auVar97);
                fVar104 = auVar75._28_4_ + auVar76._28_4_;
                auVar91 = ZEXT416((uint)(auVar86._0_4_ * (2.0 - auVar86._0_4_ * auVar129._0_4_)));
                auVar91 = vshufps_avx(auVar91,auVar91,0);
                fVar85 = (auVar75._0_4_ + fVar78 * auVar76._0_4_) * auVar91._0_4_;
                fVar98 = (auVar75._4_4_ + fVar79 * auVar76._4_4_) * auVar91._4_4_;
                local_980._4_4_ = fVar98;
                local_980._0_4_ = fVar85;
                fVar99 = (auVar75._8_4_ + fVar80 * auVar76._8_4_) * auVar91._8_4_;
                local_980._8_4_ = fVar99;
                fVar100 = (auVar75._12_4_ + fVar82 * auVar76._12_4_) * auVar91._12_4_;
                local_980._12_4_ = fVar100;
                fVar101 = (auVar75._16_4_ + fVar84 * auVar76._16_4_) * auVar91._0_4_;
                local_980._16_4_ = fVar101;
                fVar102 = (auVar75._20_4_ + fVar81 * auVar76._20_4_) * auVar91._4_4_;
                local_980._20_4_ = fVar102;
                fVar103 = (auVar75._24_4_ + fVar83 * auVar76._24_4_) * auVar91._8_4_;
                local_980._24_4_ = fVar103;
                local_980._28_4_ = fVar104;
                auVar114._16_16_ = auVar92;
                auVar114._0_16_ = auVar92;
                auVar75 = vcvtdq2ps_avx(auVar114);
                auVar91 = ZEXT416((uint)((2.0 - auVar153._0_4_ * auVar106._0_4_) * auVar106._0_4_));
                auVar91 = vshufps_avx(auVar91,auVar91,0);
                fVar105 = (fVar78 * auVar75._0_4_ + auVar112._0_4_) * auVar91._0_4_;
                fVar115 = (fVar79 * auVar75._4_4_ + auVar112._4_4_) * auVar91._4_4_;
                local_960._4_4_ = fVar115;
                local_960._0_4_ = fVar105;
                fVar116 = (fVar80 * auVar75._8_4_ + auVar112._8_4_) * auVar91._8_4_;
                local_960._8_4_ = fVar116;
                fVar117 = (fVar82 * auVar75._12_4_ + auVar112._12_4_) * auVar91._12_4_;
                local_960._12_4_ = fVar117;
                fVar118 = (fVar84 * auVar75._16_4_ + auVar112._16_4_) * auVar91._0_4_;
                local_960._16_4_ = fVar118;
                fVar119 = (fVar81 * auVar75._20_4_ + auVar112._20_4_) * auVar91._4_4_;
                local_960._20_4_ = fVar119;
                fVar120 = (fVar83 * auVar75._24_4_ + auVar112._24_4_) * auVar91._8_4_;
                local_960._24_4_ = fVar120;
                local_960._28_4_ = auVar75._28_4_ + auVar112._28_4_;
                if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0035535a:
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    return bVar70;
                  }
                  auVar75 = vrcpps_avx(local_920);
                  fVar71 = auVar75._0_4_;
                  fVar77 = auVar75._4_4_;
                  auVar49._4_4_ = fVar79 * fVar77;
                  auVar49._0_4_ = fVar78 * fVar71;
                  fVar78 = auVar75._8_4_;
                  auVar49._8_4_ = fVar80 * fVar78;
                  fVar79 = auVar75._12_4_;
                  auVar49._12_4_ = fVar82 * fVar79;
                  fVar80 = auVar75._16_4_;
                  auVar49._16_4_ = fVar84 * fVar80;
                  fVar82 = auVar75._20_4_;
                  auVar49._20_4_ = fVar81 * fVar82;
                  fVar84 = auVar75._24_4_;
                  auVar49._24_4_ = fVar83 * fVar84;
                  auVar49._28_4_ = local_920._28_4_;
                  auVar138._8_4_ = 0x3f800000;
                  auVar138._0_8_ = 0x3f8000003f800000;
                  auVar138._12_4_ = 0x3f800000;
                  auVar138._16_4_ = 0x3f800000;
                  auVar138._20_4_ = 0x3f800000;
                  auVar138._24_4_ = 0x3f800000;
                  auVar138._28_4_ = 0x3f800000;
                  auVar112 = vsubps_avx(auVar138,auVar49);
                  fVar71 = fVar71 + fVar71 * auVar112._0_4_;
                  fVar77 = fVar77 + fVar77 * auVar112._4_4_;
                  fVar78 = fVar78 + fVar78 * auVar112._8_4_;
                  fVar79 = fVar79 + fVar79 * auVar112._12_4_;
                  fVar80 = fVar80 + fVar80 * auVar112._16_4_;
                  fVar82 = fVar82 + fVar82 * auVar112._20_4_;
                  fVar84 = fVar84 + fVar84 * auVar112._24_4_;
                  local_880._4_4_ = fVar77 * local_940._4_4_;
                  local_880._0_4_ = fVar71 * local_940._0_4_;
                  local_880._8_4_ = fVar78 * local_940._8_4_;
                  local_880._12_4_ = fVar79 * local_940._12_4_;
                  local_880._16_4_ = fVar80 * local_940._16_4_;
                  local_880._20_4_ = fVar82 * local_940._20_4_;
                  local_880._24_4_ = fVar84 * local_940._24_4_;
                  local_880._28_4_ = local_940._28_4_;
                  local_8c0._4_4_ = fVar98 * fVar77;
                  local_8c0._0_4_ = fVar85 * fVar71;
                  local_8c0._8_4_ = fVar99 * fVar78;
                  local_8c0._12_4_ = fVar100 * fVar79;
                  local_8c0._16_4_ = fVar101 * fVar80;
                  local_8c0._20_4_ = fVar102 * fVar82;
                  local_8c0._24_4_ = fVar103 * fVar84;
                  local_8c0._28_4_ = fVar104;
                  local_8a0[0] = fVar105 * fVar71;
                  local_8a0[1] = fVar115 * fVar77;
                  local_8a0[2] = fVar116 * fVar78;
                  local_8a0[3] = fVar117 * fVar79;
                  fStack_890 = fVar118 * fVar80;
                  fStack_88c = fVar119 * fVar82;
                  fStack_888 = fVar120 * fVar84;
                  fStack_884 = auVar75._28_4_ + auVar112._28_4_;
                  auVar72 = vpsllw_avx(auVar72,0xf);
                  auVar72 = vpacksswb_avx(auVar72,auVar72);
                  bVar51 = SUB161(auVar72 >> 7,0) & 1 | (SUB161(auVar72 >> 0xf,0) & 1) << 1 |
                           (SUB161(auVar72 >> 0x17,0) & 1) << 2 |
                           (SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
                           (SUB161(auVar72 >> 0x27,0) & 1) << 4 |
                           (SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
                           (SUB161(auVar72 >> 0x37,0) & 1) << 6 | SUB161(auVar72 >> 0x3f,0) << 7;
                  uVar63 = (ulong)bVar51;
                  uVar62 = 0;
                  if (uVar63 != 0) {
                    for (; (bVar51 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
                    }
                  }
                  if (bVar51 != 0) {
                    local_b40 = vpshufd_avx(ZEXT416(*(uint *)(local_bb8 + 0x50)),0);
                    auStack_b30 = auVar130._16_16_;
                    local_b60 = vpshufd_avx(ZEXT416(uVar56),0);
                    auStack_b50 = auVar34._16_16_;
                    auStack_b70 = auVar35._16_16_;
                    local_b80 = *local_c50;
                    fStack_9dc = local_9e0;
                    fStack_9d8 = local_9e0;
                    fStack_9d4 = local_9e0;
                    fStack_9d0 = local_9e0;
                    fStack_9cc = local_9e0;
                    fStack_9c8 = local_9e0;
                    fStack_9c4 = local_9e0;
                    do {
                      local_a40 = local_8a0[uVar62 - 8];
                      fVar85 = local_8a0[uVar62];
                      local_a30._4_4_ = fVar85;
                      local_a30._0_4_ = fVar85;
                      local_a30._8_4_ = fVar85;
                      local_a30._12_4_ = fVar85;
                      *(float *)(ray + k * 4 + 0x80) = local_860[uVar62 - 8];
                      local_bb0.context = context->user;
                      local_a70 = local_860[uVar62];
                      fVar85 = local_840[uVar62];
                      local_a60._4_4_ = fVar85;
                      local_a60._0_4_ = fVar85;
                      local_a60._8_4_ = fVar85;
                      local_a60._12_4_ = fVar85;
                      local_a50 = local_820[uVar62];
                      local_a20 = local_b60._0_8_;
                      uStack_a18 = local_b60._8_8_;
                      local_a10 = local_b40;
                      vcmpps_avx(ZEXT1632(local_b40),ZEXT1632(local_b40),0xf);
                      uStack_9fc = (local_bb0.context)->instID[0];
                      local_a00 = uStack_9fc;
                      uStack_9f8 = uStack_9fc;
                      uStack_9f4 = uStack_9fc;
                      uStack_9f0 = (local_bb0.context)->instPrimID[0];
                      uStack_9ec = uStack_9f0;
                      uStack_9e8 = uStack_9f0;
                      uStack_9e4 = uStack_9f0;
                      local_c60 = local_b80;
                      local_bb0.valid = (int *)local_c60;
                      local_bb0.geometryUserPtr = pGVar4->userPtr;
                      local_bb0.hit = (RTCHitN *)&local_a70;
                      local_bb0.N = 4;
                      local_bb0.ray = (RTCRayN *)ray;
                      fStack_a6c = local_a70;
                      fStack_a68 = local_a70;
                      fStack_a64 = local_a70;
                      fStack_a4c = local_a50;
                      fStack_a48 = local_a50;
                      fStack_a44 = local_a50;
                      fStack_a3c = local_a40;
                      fStack_a38 = local_a40;
                      fStack_a34 = local_a40;
                      if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar4->occlusionFilterN)(&local_bb0);
                      }
                      if (local_c60 == (undefined1  [16])0x0) {
                        auVar72 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar72 = auVar72 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var5 = context->args->filter;
                        if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var5)(&local_bb0);
                        }
                        auVar91 = vpcmpeqd_avx(local_c60,_DAT_01f7aa10);
                        auVar72 = auVar91 ^ _DAT_01f7ae20;
                        auVar111._8_4_ = 0xff800000;
                        auVar111._0_8_ = 0xff800000ff800000;
                        auVar111._12_4_ = 0xff800000;
                        auVar91 = vblendvps_avx(auVar111,*(undefined1 (*) [16])
                                                          (local_bb0.ray + 0x80),auVar91);
                        *(undefined1 (*) [16])(local_bb0.ray + 0x80) = auVar91;
                      }
                      auVar93._8_8_ = 0x100000001;
                      auVar93._0_8_ = 0x100000001;
                      if ((auVar93 & auVar72) != (undefined1  [16])0x0) goto LAB_0035535a;
                      *(float *)(ray + k * 4 + 0x80) = local_9e0;
                      uVar63 = uVar63 ^ 1L << (uVar62 & 0x3f);
                      uVar62 = 0;
                      if (uVar63 != 0) {
                        for (; (uVar63 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
                        }
                      }
                    } while (uVar63 != 0);
                  }
                }
              }
            }
            uVar57 = uVar57 & uVar57 - 1;
          } while (uVar57 != 0);
        }
        local_bd8 = local_bd8 + 1;
        auVar141 = ZEXT1664(local_ab0);
        auVar144 = ZEXT1664(local_ac0);
        auVar154 = ZEXT1664(local_ad0);
        auVar186 = ZEXT1664(local_b10);
        auVar188 = ZEXT1664(local_b20);
        fVar85 = local_ae0;
        fVar80 = fStack_adc;
        fVar82 = fStack_ad8;
        fVar84 = fStack_ad4;
        fVar78 = local_af0;
        fVar81 = fStack_aec;
        fVar83 = fStack_ae8;
        fVar98 = fStack_ae4;
        fVar79 = local_b00;
        fVar99 = fStack_afc;
        fVar100 = fStack_af8;
        fVar101 = fStack_af4;
      } while (local_bd8 != local_be0);
    }
    bVar70 = local_c18 != &local_800;
    uVar57 = local_c40;
    uVar62 = local_c20;
    uVar63 = local_c28;
    uVar64 = local_c30;
    uVar65 = local_c38;
    uVar67 = local_c48;
joined_r0x003548e0:
    if (!bVar70) {
      return bVar70;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }